

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O2

void dumpNodeToDot(PSNode *node,PTType type)

{
  long *plVar1;
  undefined8 *puVar2;
  type tVar3;
  int iVar4;
  uint uVar5;
  char *__format;
  long *plVar6;
  undefined8 *puVar7;
  Pointer PVar8;
  const_iterator __begin1;
  
  uVar5 = 0;
  printf("\tNODE%u [label=\"<%u> ",(ulong)*(uint *)(node + 8));
  printPSNodeType(*(PSNodeType *)(node + 0x90));
  printf("\\n");
  printName(node,true);
  if (*(uint **)(node + 0xa0) != (uint *)0x0) {
    uVar5 = **(uint **)(node + 0xa0);
  }
  printf("\\nparent: %u\\n",(ulong)uVar5);
  if (*(int *)(node + 0x90) == 1) {
    if (((*(long *)(node + 0x88) != 0) || (((byte)node[0xe9] & 1) != 0)) ||
       (node[0xe8] == (PSNode)0x1)) {
      printf("\\n[size: %zu, heap: %u, zeroed: %u]",*(long *)(node + 0x88),(ulong)(byte)node[0xe9],
             (ulong)(byte)node[0xe8]);
    }
  }
  if (verbose[0x80] == 1) {
    iVar4 = *(int *)(node + 0x90);
    if (iVar4 == 0xb) {
      printf("called from: [");
      plVar1 = *(long **)(node + 0x110);
      for (plVar6 = *(long **)(node + 0x108); plVar6 != plVar1; plVar6 = plVar6 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar6 + 8));
      }
      printf("]\\n");
      iVar4 = *(int *)(node + 0x90);
    }
    if (iVar4 == 10) {
      printf("returns from: [");
      plVar1 = *(long **)(node + 0xf0);
      for (plVar6 = *(long **)(node + 0xe8); plVar6 != plVar1; plVar6 = plVar6 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar6 + 8));
      }
      printf("]\\n");
      iVar4 = *(int *)(node + 0x90);
    }
    if (iVar4 == 0xc) {
      printf("returns to: [");
      plVar1 = *(long **)(node + 0xf0);
      for (plVar6 = *(long **)(node + 0xe8); plVar6 != plVar1; plVar6 = plVar6 + 1) {
        printf("%u ",(ulong)*(uint *)(*plVar6 + 8));
      }
      printf("]\\n");
    }
  }
  if ((verbose[0x80] == 1) && (*(long *)(node + 0x60) != *(long *)(node + 0x58))) {
    printf("\\n--- operands ---\\n");
    puVar2 = *(undefined8 **)(node + 0x60);
    for (puVar7 = *(undefined8 **)(node + 0x58); puVar7 != puVar2; puVar7 = puVar7 + 1) {
      printName((PSNode *)*puVar7,true);
    }
    printf("\\n------\\n");
  }
  if (((verbose[0x80] & 1) != 0) && (*(long *)(node + 200) != 0)) {
    printf("\\n--- points-to set ---\\n");
  }
  dg::ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&__begin1.container_it,
          (SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)(node + 0xb0));
  tVar3 = dg::Offset::UNKNOWN;
  while ((__begin1.container_it.pos != 0 ||
         (__begin1.container_it.container_it.
          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur !=
          (__node_type *)0x0))) {
    PVar8 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                      ((const_iterator *)&__begin1.container_it);
    printf("\\n    -> ");
    printName(PVar8.target,true);
    printf(" + ");
    if (PVar8.offset.offset.offset == tVar3) {
      printf("Offset::UNKNOWN");
    }
    else {
      printf("%lu",PVar8.offset.offset.offset);
    }
    dg::ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++(&__begin1.container_it);
  }
  if (verbose[0x80] != 0) {
    dumpPointerGraphData(node,type,true);
  }
  printf("\", shape=box");
  if (*(int *)(node + 0x90) == 3) {
    __format = ", style=filled, fillcolor=orange";
  }
  else {
    if (((*(long *)(node + 200) != 0) || (uVar5 = *(int *)(node + 0x90) - 2, 4 < uVar5)) ||
       ((0x1dU >> (uVar5 & 0x1f) & 1) == 0)) goto LAB_0011d5ba;
    __format = ", style=filled, fillcolor=red";
  }
  printf(__format);
LAB_0011d5ba:
  puts("]");
  return;
}

Assistant:

static void dumpNodeToDot(PSNode *node, PTType type) {
    printf("\tNODE%u [label=\"<%u> ", node->getID(), node->getID());
    printPSNodeType(node->getType());
    printf("\\n");
    printName(node, true);
    printf("\\nparent: %u\\n",
           node->getParent() ? node->getParent()->getID() : 0);

    PSNodeAlloc *alloc = PSNodeAlloc::get(node);
    if (alloc &&
        (alloc->getSize() || alloc->isHeap() || alloc->isZeroInitialized()))
        printf("\\n[size: %zu, heap: %u, zeroed: %u]", alloc->getSize(),
               alloc->isHeap(), alloc->isZeroInitialized());
    if (verbose) {
        if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
            printf("called from: [");
            for (auto *r : entry->getCallers())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeCallRet *CR = PSNodeCallRet::get(node)) {
            printf("returns from: [");
            for (auto *r : CR->getReturns())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeRet *R = PSNodeRet::get(node)) {
            printf("returns to: [");
            for (auto *r : R->getReturnSites())
                printf("%u ", r->getID());
            printf("]\\n");
        }
    }

    if (verbose && node->getOperandsNum() > 0) {
        printf("\\n--- operands ---\\n");
        for (PSNode *op : node->getOperands()) {
            printName(op, true);
        }
        printf("\\n------\\n");
    }

    if (verbose && !node->pointsTo.empty()) {
        printf("\\n--- points-to set ---\\n");
    }

    for (const Pointer &ptr : node->pointsTo) {
        printf("\\n    -> ");
        printName(ptr.target, true);
        printf(" + ");
        if (ptr.offset.isUnknown())
            printf("Offset::UNKNOWN");
        else
            printf("%" PRIu64, *ptr.offset);
    }

    if (verbose) {
        dumpPointerGraphData(node, type, true /* dot */);
    }

    printf("\", shape=box");
    if (node->getType() != PSNodeType::STORE) {
        if (node->pointsTo.empty() && (node->getType() == PSNodeType::LOAD ||
                                       node->getType() == PSNodeType::GEP ||
                                       node->getType() == PSNodeType::CAST ||
                                       node->getType() == PSNodeType::PHI))
            printf(", style=filled, fillcolor=red");
    } else {
        printf(", style=filled, fillcolor=orange");
    }

    printf("]\n");
}